

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::benchmarkStarting(ConsoleReporter *this,BenchmarkInfo *info)

{
  int iVar1;
  TablePrinter *pTVar2;
  Duration local_28;
  
  pTVar2 = Catch::operator<<((this->m_tablePrinter)._M_t.
                             super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>
                             .super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl,
                             &info->samples);
  Catch::operator<<(pTVar2);
  pTVar2 = Catch::operator<<(pTVar2,&info->iterations);
  Catch::operator<<(pTVar2);
  iVar1 = (*(((this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0x15])();
  if ((char)iVar1 == '\0') {
    pTVar2 = (this->m_tablePrinter)._M_t.
             super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>.
             _M_t.
             super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>
             .super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl;
    local_28.m_inNanoseconds = info->estimatedDuration;
    if (1000.0 <= local_28.m_inNanoseconds) {
      if (local_28.m_inNanoseconds < 1000000.0) {
        local_28.m_units = Microseconds;
      }
      else if (local_28.m_inNanoseconds < 1000000000.0) {
        local_28.m_units = Milliseconds;
      }
      else {
        local_28.m_units = local_28.m_inNanoseconds < 60000000000.0 ^ Minutes;
      }
    }
    else {
      local_28.m_units = Nanoseconds;
    }
    Catch::operator<<(pTVar2,&local_28);
    Catch::operator<<(pTVar2);
  }
  return;
}

Assistant:

void ConsoleReporter::benchmarkStarting(BenchmarkInfo const& info) {
    (*m_tablePrinter) << info.samples << ColumnBreak()
        << info.iterations << ColumnBreak();
    if (!m_config->benchmarkNoAnalysis())
        (*m_tablePrinter) << Duration(info.estimatedDuration) << ColumnBreak();
}